

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<double,float>
          (internal *this,char *expected_expression,char *actual_expression,double *expected,
          float *actual)

{
  String *extraout_RDX;
  String *extraout_RDX_00;
  AssertionResult AVar2;
  String local_40;
  String local_30;
  scoped_ptr<testing::internal::String> sVar1;
  
  if ((*expected != (double)*actual) || (NAN(*expected) || NAN((double)*actual))) {
    StreamableToString<double>((internal *)&local_30,expected);
    StreamableToString<float>((internal *)&local_40,actual);
    AVar2 = EqFailure(this,expected_expression,actual_expression,&local_30,&local_40,false);
    sVar1 = AVar2.message_.ptr_;
    if (local_40.c_str_ != (char *)0x0) {
      operator_delete__(local_40.c_str_);
      sVar1.ptr_ = extraout_RDX;
    }
    if (local_30.c_str_ != (char *)0x0) {
      operator_delete__(local_30.c_str_);
      sVar1.ptr_ = extraout_RDX_00;
    }
  }
  else {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
#pragma warning(push)          // Saves the current warning state.
#pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
#pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}